

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall
fasttext::Dictionary::computeNgrams
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *subngram,
          subentry *sublemma,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *submorph,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *subipangram)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  element_type *peVar4;
  int iVar5;
  uint uVar6;
  iterator iVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pbVar12;
  long lVar13;
  size_type sVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  pointer pbVar18;
  subentry e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  morphValues;
  string val;
  string value;
  string charn;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propsValues;
  value_type local_138;
  undefined1 local_110 [24];
  long lStack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  ulong local_d0;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  vector<int,_std::allocator<int>_> *local_a8;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  key_type local_80;
  subentry *local_60;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *local_58;
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_60 = sublemma;
  local_58 = submorph;
  local_50 = subngram;
  utils::split(&local_48,word,'~');
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar17 = 0;
    local_a8 = ngrams;
    do {
      local_c8 = local_b8;
      pcVar2 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,
                 pcVar2 + local_48.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_string_length);
      std::__cxx11::string::find((char)(string *)&local_c8,0x3a);
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_c8);
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->props)._M_h,&local_80);
      if (iVar7.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        iVar5 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar5 == 0) {
          std::__cxx11::string::find((char)&local_c8,0x3a);
          std::__cxx11::string::substr((ulong)local_110,(ulong)&local_c8);
          plVar9 = (long *)std::__cxx11::string::replace
                                     ((ulong)local_110,0,(char *)0x0,BOW_abi_cxx11_);
          paVar1 = &local_138.subword.field_2;
          puVar10 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar10) {
            local_138.subword.field_2._M_allocated_capacity = *puVar10;
            local_138.subword.field_2._8_8_ = plVar9[3];
            local_138.subword._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_138.subword.field_2._M_allocated_capacity = *puVar10;
            local_138.subword._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_138.subword._M_string_length = plVar9[1];
          *plVar9 = (long)puVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_138,EOW_abi_cxx11_);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar11) {
            local_e0._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_e0._8_8_ = plVar9[3];
            local_f0._M_allocated_capacity = (size_type)&local_e0;
          }
          else {
            local_e0._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_f0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar9;
          }
          local_f0._8_8_ = plVar9[1];
          *plVar9 = (long)paVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.subword._M_dataplus._M_p != paVar1) {
            operator_delete(local_138.subword._M_dataplus._M_p);
          }
          local_d0 = uVar17;
          if ((pointer)local_110._0_8_ != (pointer)(local_110 + 0x10)) {
            operator_delete((void *)local_110._0_8_);
          }
          if (local_f0._8_8_ != 0) {
            uVar17 = 0;
            do {
              local_110._0_8_ = local_110 + 0x10;
              local_110._8_8_ = (pointer)0x0;
              local_110._16_8_ = local_110._16_8_ & 0xffffffffffffff00;
              if (uVar17 < (ulong)local_f0._8_8_) {
                uVar15 = 1;
                uVar16 = uVar17;
                do {
                  if ((ulong)(long)((this->args_).
                                    super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->maxn < uVar15) break;
                  std::__cxx11::string::push_back
                            ((char)(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_110);
                  uVar16 = uVar16 + 1;
                  peVar4 = (this->args_).
                           super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  if ((ulong)(long)peVar4->minn <= uVar15) {
                    if ((uVar15 != 1) || (uVar17 != 0 && uVar16 != local_f0._8_8_)) {
                      uVar6 = 0x811c9dc5;
                      if ((pointer)local_110._8_8_ != (pointer)0x0) {
                        pbVar12 = (pointer)0x0;
                        do {
                          uVar6 = ((int)*(char *)((long)&((_Alloc_hider *)local_110._0_8_)->_M_p +
                                                 (long)&(pbVar12->_M_dataplus)._M_p) ^ uVar6) *
                                  0x1000193;
                          pbVar12 = (pointer)((long)&(pbVar12->_M_dataplus)._M_p + 1);
                        } while ((pointer)local_110._8_8_ != pbVar12);
                      }
                      uVar6 = uVar6 % (uint)peVar4->bucket;
                      iVar5 = this->nwords_ + uVar6;
                      local_138.subword._M_dataplus._M_p._0_4_ = iVar5;
                      iVar3._M_current =
                           (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                      if (iVar3._M_current ==
                          (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                  (local_a8,iVar3,(int *)&local_138);
                      }
                      else {
                        *iVar3._M_current = iVar5;
                        (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                      }
                      local_138.subword._M_dataplus._M_p = (pointer)&local_138.subword.field_2;
                      local_138.subword._M_string_length = 0;
                      local_138.subword.field_2._M_allocated_capacity =
                           local_138.subword.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      std::__cxx11::string::_M_assign((string *)&local_138);
                      local_138.id = (long)(int)uVar6 + (long)this->nwords_;
                      std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::
                      push_back(local_50,&local_138);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_138.subword._M_dataplus._M_p != &local_138.subword.field_2) {
                        operator_delete(local_138.subword._M_dataplus._M_p);
                      }
                    }
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar16 < (ulong)local_f0._8_8_);
              }
              if ((pointer)local_110._0_8_ != (pointer)(local_110 + 0x10)) {
                operator_delete((void *)local_110._0_8_);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < (ulong)local_f0._8_8_);
          }
          uVar17 = local_d0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_allocated_capacity != &local_e0) {
            operator_delete((void *)local_f0._M_allocated_capacity);
            uVar17 = local_d0;
          }
        }
        else {
          std::__cxx11::string::find((char)&local_c8,0x3a);
          std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_c8);
          iVar5 = std::__cxx11::string::compare((char *)&local_80);
          if (iVar5 == 0) {
            uVar6 = 0x811c9dc5;
            if (local_c0 != 0) {
              lVar13 = 0;
              do {
                uVar6 = ((int)(char)local_c8[lVar13] ^ uVar6) * 0x1000193;
                lVar13 = lVar13 + 1;
              } while (local_c0 != lVar13);
            }
            uVar6 = uVar6 % (uint)((this->args_).
                                   super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->bucket;
            local_60->id = (long)(int)uVar6 + (long)this->nwords_;
            local_d0 = uVar17;
            std::__cxx11::string::_M_assign((string *)local_60);
            iVar5 = uVar6 + this->nwords_;
            local_138.subword._M_dataplus._M_p._0_4_ = iVar5;
            iVar3._M_current =
                 (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_a8,iVar3,(int *)&local_138);
              uVar17 = local_d0;
            }
            else {
              *iVar3._M_current = iVar5;
              (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              uVar17 = local_d0;
            }
          }
          iVar5 = std::__cxx11::string::compare((char *)&local_80);
          if (iVar5 == 0) {
            utils::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_110,(string *)&local_f0,'+');
            if (local_110._8_8_ != local_110._0_8_) {
              uVar16 = 0;
              do {
                if (((pointer)(local_110._0_8_ + uVar16 * 0x20))->_M_string_length == 0) {
                  uVar6 = 0x811c9dc5;
                }
                else {
                  uVar6 = 0x811c9dc5;
                  sVar14 = 0;
                  do {
                    uVar6 = ((int)(((pointer)(local_110._0_8_ + uVar16 * 0x20))->_M_dataplus)._M_p
                                  [sVar14] ^ uVar6) * 0x1000193;
                    sVar14 = sVar14 + 1;
                  } while (((pointer)(local_110._0_8_ + uVar16 * 0x20))->_M_string_length != sVar14)
                  ;
                }
                uVar6 = uVar6 % (uint)((this->args_).
                                       super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->bucket;
                local_138.subword._M_dataplus._M_p = (pointer)&local_138.subword.field_2;
                local_138.subword._M_string_length = 0;
                local_138.subword.field_2._M_allocated_capacity =
                     local_138.subword.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_138.id = (long)(int)uVar6 + (long)this->nwords_;
                std::__cxx11::string::_M_assign((string *)&local_138);
                std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::push_back
                          (local_58,&local_138);
                iVar5 = uVar6 + this->nwords_;
                local_a0 = (undefined1 *)CONCAT44(local_a0._4_4_,iVar5);
                iVar3._M_current =
                     (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (local_a8,iVar3,(int *)&local_a0);
                }
                else {
                  *iVar3._M_current = iVar5;
                  (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138.subword._M_dataplus._M_p != &local_138.subword.field_2) {
                  operator_delete(local_138.subword._M_dataplus._M_p);
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 < (ulong)((long)(local_110._8_8_ - local_110._0_8_) >> 5));
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_110);
          }
          iVar5 = std::__cxx11::string::compare((char *)&local_80);
          if (iVar5 == 0) {
            std::__cxx11::string::find((char)&local_c8,0x3a);
            std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_c8);
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,BOW_abi_cxx11_);
            paVar1 = &local_138.subword.field_2;
            puVar10 = puVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_138.subword.field_2._M_allocated_capacity = *puVar10;
              local_138.subword.field_2._8_8_ = puVar8[3];
              local_138.subword._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_138.subword.field_2._M_allocated_capacity = *puVar10;
              local_138.subword._M_dataplus._M_p = (pointer)*puVar8;
            }
            local_138.subword._M_string_length = puVar8[1];
            *puVar8 = puVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_138,EOW_abi_cxx11_);
            pbVar12 = (pointer)(plVar9 + 2);
            if ((pointer)*plVar9 == pbVar12) {
              local_110._16_8_ = (pbVar12->_M_dataplus)._M_p;
              lStack_f8 = plVar9[3];
              local_110._0_8_ = (pointer)(local_110 + 0x10);
            }
            else {
              local_110._16_8_ = (pbVar12->_M_dataplus)._M_p;
              local_110._0_8_ = (pointer)*plVar9;
            }
            local_110._8_8_ = plVar9[1];
            *plVar9 = (long)pbVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138.subword._M_dataplus._M_p != paVar1) {
              operator_delete(local_138.subword._M_dataplus._M_p);
            }
            local_d0 = uVar17;
            if (local_a0 != local_90) {
              operator_delete(local_a0);
            }
            if ((pointer)local_110._8_8_ != (pointer)0x0) {
              pbVar12 = (pointer)0x0;
              do {
                local_a0 = local_90;
                local_98 = 0;
                local_90[0] = 0;
                if (pbVar12 < (ulong)local_110._8_8_) {
                  uVar17 = 1;
                  pbVar18 = pbVar12;
                  do {
                    if ((ulong)(long)((this->args_).
                                      super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->maxn < uVar17) break;
                    std::__cxx11::string::push_back((char)&local_a0);
                    pbVar18 = (pointer)((long)&(pbVar18->_M_dataplus)._M_p + 1);
                    peVar4 = (this->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    if ((ulong)(long)peVar4->minn <= uVar17) {
                      if ((uVar17 != 1) ||
                         (pbVar12 != (pointer)0x0 && pbVar18 != (pointer)local_110._8_8_)) {
                        uVar6 = 0x811c9dc5;
                        if (local_98 != 0) {
                          lVar13 = 0;
                          do {
                            uVar6 = ((int)(char)local_a0[lVar13] ^ uVar6) * 0x1000193;
                            lVar13 = lVar13 + 1;
                          } while (local_98 != lVar13);
                        }
                        uVar6 = uVar6 % (uint)peVar4->bucket;
                        iVar5 = this->nwords_ + uVar6;
                        local_138.subword._M_dataplus._M_p._0_4_ = iVar5;
                        iVar3._M_current =
                             (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish;
                        if (iVar3._M_current ==
                            (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                                    (local_a8,iVar3,(int *)&local_138);
                        }
                        else {
                          *iVar3._M_current = iVar5;
                          (local_a8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                        }
                        local_138.subword._M_dataplus._M_p = (pointer)&local_138.subword.field_2;
                        local_138.subword._M_string_length = 0;
                        local_138.subword.field_2._M_allocated_capacity =
                             local_138.subword.field_2._M_allocated_capacity & 0xffffffffffffff00;
                        std::__cxx11::string::_M_assign((string *)&local_138);
                        local_138.id = (long)(int)uVar6 + (long)this->nwords_;
                        std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::
                        push_back(subipangram,&local_138);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138.subword._M_dataplus._M_p != &local_138.subword.field_2) {
                          operator_delete(local_138.subword._M_dataplus._M_p);
                        }
                      }
                    }
                    uVar17 = uVar17 + 1;
                  } while (pbVar18 < (ulong)local_110._8_8_);
                }
                if (local_a0 != local_90) {
                  operator_delete(local_a0);
                }
                pbVar12 = (pointer)((long)&(pbVar12->_M_dataplus)._M_p + 1);
              } while (pbVar12 < (ulong)local_110._8_8_);
            }
            uVar17 = local_d0;
            if ((pointer)local_110._0_8_ != (pointer)(local_110 + 0x10)) {
              operator_delete((void *)local_110._0_8_);
              uVar17 = local_d0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_allocated_capacity != &local_e0) {
            operator_delete((void *)local_f0._M_allocated_capacity);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)local_48.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Dictionary::computeNgrams(const std::string& word,
                               std::vector<int32_t>& ngrams,
			      std::vector<subentry>& subngram,
	                      subentry& sublemma,
                              std::vector<subentry>& submorph,
			      std::vector<subentry>& subipangram) const {
  //char x;
  std::vector<std::string> propsValues = utils::split(word, '~');
  for (size_t i = 0; i < propsValues.size(); i++) {
    std::string value = propsValues[i];
	std::string prop = value.substr(0, value.find(PROP_VALUE_SEP));
  const bool useProp = args_->props.find(prop) != args_->props.end();
	if (useProp) {
	   if(prop == "w"){

        // If only whole word  uncomment next two lines and comment rest code in the if loop
		/*int32_t h = hash(value) % args_->bucket;
		ngrams.push_back(nwords_ + h);*/

       // Default consider character-ngrams
	   std::string temp_word = BOW + value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos) + EOW;
	   for (size_t i = 0; i < temp_word.size(); i++) {
            std::string charn;
            if ((temp_word[i] & 0xC0) == 0x80) continue;
            for (size_t j = i, n = 1; j < temp_word.size() && n <= args_->maxn; n++) {
              charn.push_back(temp_word[j++]);
              while (j < temp_word.size() && (temp_word[j] & 0xC0) == 0x80) {
                charn.push_back(temp_word[j++]);
              }
              if (n >= args_->minn && !(n == 1 && (i == 0 || j == temp_word.size()))) {
                int32_t h = hash(charn) % args_->bucket;
                ngrams.push_back(nwords_ + h);
		        subentry e;
		        e.subword = charn;
		        e.id = nwords_+h;
		        subngram.push_back(e);
              }
            }
          }
	}
	else{
         std::string val = value.substr(value.find(PROP_VALUE_SEP)+1, std::string::npos);
         if(prop == "l"){
	  	    int32_t h = hash(value) % args_->bucket;
            sublemma.id = nwords_+h;
		    sublemma.subword = value;
	        ngrams.push_back(nwords_ + h);
	      }
	    if(prop == "m"){
            //Default encodes each morph tag separately
		    std::vector<std::string> morphValues = utils::split(val, '+');

		    for(int32_t m=0;m<morphValues.size();m++){
			    int32_t h = hash( morphValues[m]) % args_->bucket;
			    subentry e;
			    e.id = nwords_+h;
			    e.subword =  morphValues[m];
			    submorph.push_back(e);
	   		    ngrams.push_back(nwords_ + h);
		    }

          //Encodes the morphology tags as a whole
		  /*subentry e;
		  std::string val = value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos);
		  if(value=="")
		  { value = "m:<unk>";}
		  int32_t h = hash(value) % args_->bucket;
		  e.id = nwords_+h;
		  e.subword = value;
		  submorph.push_back(e);
		  ngrams.push_back(nwords_+h);*/
	    }

        if(prop == "ipa"){
	
	      std::string temp_word = BOW + value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos) + EOW;
	      for (size_t i = 0; i < temp_word.size(); i++) {
                std::string charn;
                if ((temp_word[i] & 0xC0) == 0x80) continue;
                for (size_t j = i, n = 1; j < temp_word.size() && n <= args_->maxn; n++) {
                    charn.push_back(temp_word[j++]);
                    while (j < temp_word.size() && (temp_word[j] & 0xC0) == 0x80) {
                    charn.push_back(temp_word[j++]);
                 }
              if (n >= args_->minn && !(n == 1 && (i == 0 || j == temp_word.size()))) {
                int32_t h = hash(charn) % args_->bucket;
                ngrams.push_back(nwords_ + h);
		        subentry e;
		        e.subword = charn;
		        e.id = nwords_+h;
		        subipangram.push_back(e);
              }
            }
          }
	    }
	  }
	}
  }
}